

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  char cVar1;
  bool bVar2;
  int *piVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  int *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  u8 doOmit;
  u8 op;
  int jj;
  sqlite3_index_constraint *p;
  int iIdx;
  i64 nRow;
  int bMatch;
  int ii;
  int rc;
  Rtree *pRtree;
  char zIdxStr [41];
  int in_stack_ffffffffffffff5c;
  undefined1 local_86;
  char local_85;
  int local_84;
  int local_74;
  int local_60;
  int local_3c;
  char local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  local_74 = 0;
  memset(local_38,0xaa,0x29);
  memset(local_38,0,0x29);
  for (local_60 = 0; local_60 < *in_RSI; local_60 = local_60 + 1) {
    if (*(char *)(*(long *)(in_RSI + 2) + (long)local_60 * 0xc + 4) == '@') {
      bVar2 = true;
    }
  }
  for (local_60 = 0; local_60 < *in_RSI && local_74 < 0x28; local_60 = local_60 + 1) {
    piVar3 = (int *)(*(long *)(in_RSI + 2) + (long)local_60 * 0xc);
    if ((((!bVar2) && (*(char *)((long)piVar3 + 5) != '\0')) && (*piVar3 < 1)) &&
       ((char)piVar3[1] == '\x02')) {
      for (local_84 = 0; local_84 < local_60; local_84 = local_84 + 1) {
        *(undefined4 *)(*(long *)(in_RSI + 8) + (long)local_84 * 8) = 0;
        *(undefined1 *)(*(long *)(in_RSI + 8) + 4 + (long)local_84 * 8) = 0;
      }
      in_RSI[10] = 1;
      *(undefined4 *)(*(long *)(in_RSI + 8) + (long)local_60 * 8) = 1;
      *(undefined1 *)(*(long *)(in_RSI + 8) + 4 + (long)local_84 * 8) = 1;
      in_RSI[0x10] = 0;
      in_RSI[0x11] = 0x403e0000;
      in_RSI[0x12] = 1;
      in_RSI[0x13] = 0;
      in_RSI[0x14] = 1;
      local_3c = 0;
      goto LAB_0029780a;
    }
    if ((*(char *)((long)piVar3 + 5) != '\0') &&
       (((0 < *piVar3 && (*piVar3 <= (int)(uint)*(byte *)(in_RDI + 0x25))) ||
        ((char)piVar3[1] == '@')))) {
      local_86 = 1;
      cVar1 = (char)piVar3[1];
      if (cVar1 == '\x02') {
        local_85 = 'A';
        local_86 = 0;
      }
      else if (cVar1 == '\x04') {
        local_85 = 'E';
        local_86 = 0;
      }
      else if (cVar1 == '\b') {
        local_85 = 'B';
      }
      else if (cVar1 == '\x10') {
        local_85 = 'C';
        local_86 = 0;
      }
      else if (cVar1 == ' ') {
        local_85 = 'D';
      }
      else if (cVar1 == '@') {
        local_85 = 'F';
      }
      else {
        local_85 = '\0';
      }
      if (local_85 != '\0') {
        iVar6 = local_74 + 1;
        local_38[local_74] = local_85;
        local_74 = local_74 + 2;
        local_38[iVar6] = (char)*piVar3 + '/';
        *(int *)(*(long *)(in_RSI + 8) + (long)local_60 * 8) = local_74 / 2;
        *(undefined1 *)(*(long *)(in_RSI + 8) + 4 + (long)local_60 * 8) = local_86;
      }
    }
  }
  in_RSI[10] = 2;
  in_RSI[0xe] = 1;
  if (0 < local_74) {
    pvVar4 = sqlite3_malloc(in_stack_ffffffffffffff5c);
    *(void **)(in_RSI + 0xc) = pvVar4;
    if (*(long *)(in_RSI + 0xc) == 0) {
      local_3c = 7;
      goto LAB_0029780a;
    }
    memcpy(*(void **)(in_RSI + 0xc),local_38,(long)(local_74 + 1));
  }
  lVar5 = *(long *)(in_RDI + 0x50) >> ((byte)(local_74 / 2) & 0x3f);
  *(double *)(in_RSI + 0x10) = (double)lVar5 * 6.0;
  *(long *)(in_RSI + 0x12) = lVar5;
  local_3c = 0;
LAB_0029780a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

static int rtreeBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  Rtree *pRtree = (Rtree*)tab;
  int rc = SQLITE_OK;
  int ii;
  int bMatch = 0;                 /* True if there exists a MATCH constraint */
  i64 nRow;                       /* Estimated rows returned by this scan */

  int iIdx = 0;
  char zIdxStr[RTREE_MAX_DIMENSIONS*8+1];
  memset(zIdxStr, 0, sizeof(zIdxStr));

  /* Check if there exists a MATCH constraint - even an unusable one. If there
  ** is, do not consider the lookup-by-rowid plan as using such a plan would
  ** require the VDBE to evaluate the MATCH constraint, which is not currently
  ** possible. */
  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    if( pIdxInfo->aConstraint[ii].op==SQLITE_INDEX_CONSTRAINT_MATCH ){
      bMatch = 1;
    }
  }

  assert( pIdxInfo->idxStr==0 );
  for(ii=0; ii<pIdxInfo->nConstraint && iIdx<(int)(sizeof(zIdxStr)-1); ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];

    if( bMatch==0 && p->usable
     && p->iColumn<=0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ
    ){
      /* We have an equality constraint on the rowid. Use strategy 1. */
      int jj;
      for(jj=0; jj<ii; jj++){
        pIdxInfo->aConstraintUsage[jj].argvIndex = 0;
        pIdxInfo->aConstraintUsage[jj].omit = 0;
      }
      pIdxInfo->idxNum = 1;
      pIdxInfo->aConstraintUsage[ii].argvIndex = 1;
      pIdxInfo->aConstraintUsage[jj].omit = 1;

      /* This strategy involves a two rowid lookups on an B-Tree structures
      ** and then a linear search of an R-Tree node. This should be
      ** considered almost as quick as a direct rowid lookup (for which
      ** sqlite uses an internal cost of 0.0). It is expected to return
      ** a single row.
      */
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
      return SQLITE_OK;
    }

    if( p->usable
    && ((p->iColumn>0 && p->iColumn<=pRtree->nDim2)
        || p->op==SQLITE_INDEX_CONSTRAINT_MATCH)
    ){
      u8 op;
      u8 doOmit = 1;
      switch( p->op ){
        case SQLITE_INDEX_CONSTRAINT_EQ:    op = RTREE_EQ;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_GT:    op = RTREE_GT;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_LE:    op = RTREE_LE;    break;
        case SQLITE_INDEX_CONSTRAINT_LT:    op = RTREE_LT;    doOmit = 0; break;
        case SQLITE_INDEX_CONSTRAINT_GE:    op = RTREE_GE;    break;
        case SQLITE_INDEX_CONSTRAINT_MATCH: op = RTREE_MATCH; break;
        default:                            op = 0;           break;
      }
      if( op ){
        zIdxStr[iIdx++] = op;
        zIdxStr[iIdx++] = (char)(p->iColumn - 1 + '0');
        pIdxInfo->aConstraintUsage[ii].argvIndex = (iIdx/2);
        pIdxInfo->aConstraintUsage[ii].omit = doOmit;
      }
    }
  }

  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if( iIdx>0 ){
    pIdxInfo->idxStr = sqlite3_malloc( iIdx+1 );
    if( pIdxInfo->idxStr==0 ){
      return SQLITE_NOMEM;
    }
    memcpy(pIdxInfo->idxStr, zIdxStr, iIdx+1);
  }

  nRow = pRtree->nRowEst >> (iIdx/2);
  pIdxInfo->estimatedCost = (double)6.0 * (double)nRow;
  pIdxInfo->estimatedRows = nRow;

  return rc;
}